

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

uint32_t gpioDelay(uint32_t micros)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_EDI;
  uint32_t start;
  int in_stack_00000028;
  int in_stack_0000002c;
  uint in_stack_00000030;
  uint32_t local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: microseconds=%u\n",pcVar2,"gpioDelay",(ulong)in_EDI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioDelay");
    }
    local_4 = 0xffffffe1;
  }
  else {
    local_4 = systReg[1];
    if (in_EDI < 0x65) {
      do {
      } while (systReg[1] - local_4 <= in_EDI);
    }
    else {
      gpioSleep(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    }
    local_4 = systReg[1] - local_4;
  }
  return local_4;
}

Assistant:

uint32_t gpioDelay(uint32_t micros)
{
   uint32_t start;

   DBG(DBG_USER, "microseconds=%u", micros);

   CHECK_INITED;

   start = systReg[SYST_CLO];

   if (micros <= PI_MAX_BUSY_DELAY)
      while ((systReg[SYST_CLO] - start) <= micros);
   else
      gpioSleep(PI_TIME_RELATIVE, (micros/MILLION), (micros%MILLION));

   return (systReg[SYST_CLO] - start);
}